

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O3

HT_ErrorCode
ht_timeline_listener_container_register_listener
          (HT_TimelineListenerContainer *container,HT_TimelineListenerCallback callback,
          void *user_data,HT_DestroyCallback destroy_cb)

{
  HT_TimelineListenerEntry data;
  HT_ErrorCode HVar1;
  HT_TimelineListenerEntry entry;
  
  ht_mutex_lock(container->mutex);
  data.user_data = user_data;
  data.callback = callback;
  data.destroy_cb = destroy_cb;
  HVar1 = ht_bag_listener_add(&container->entries,data);
  ht_mutex_unlock(container->mutex);
  return HVar1;
}

Assistant:

HT_ErrorCode
ht_timeline_listener_container_register_listener(
        HT_TimelineListenerContainer* container,
        HT_TimelineListenerCallback callback,
        void* user_data,
        HT_DestroyCallback destroy_cb)
{
    HT_ErrorCode error_code;
    HT_TimelineListenerEntry entry = {
        callback, user_data, destroy_cb
    };
    ht_mutex_lock(container->mutex);
    /* weird cast because of ISO C forbids passing argument 2 of
       'ht_bag_add' between function pointer and 'void *' */
    error_code = ht_bag_listener_add(&container->entries, entry);
    if (error_code != HT_ERR_OK)
    {
        goto done;
    }

done:
    ht_mutex_unlock(container->mutex);
    return error_code;
}